

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_Session * UA_SecureChannel_getSession(UA_SecureChannel *channel,UA_NodeId *token)

{
  UA_Session *pUVar1;
  UA_Boolean UVar2;
  SessionEntry *pSVar3;
  
  pSVar3 = (SessionEntry *)&channel->sessions;
  do {
    pSVar3 = (pSVar3->pointers).le_next;
    if (pSVar3 == (SessionEntry *)0x0) {
      return (UA_Session *)0x0;
    }
    pUVar1 = pSVar3->session;
    UVar2 = UA_NodeId_equal(&pUVar1->authenticationToken,token);
  } while (!UVar2);
  return pUVar1;
}

Assistant:

UA_Session * UA_SecureChannel_getSession(UA_SecureChannel *channel, UA_NodeId *token) {
    struct SessionEntry *se;
    LIST_FOREACH(se, &channel->sessions, pointers) {
        if(UA_NodeId_equal(&se->session->authenticationToken, token))
            break;
    }
    if(!se)
        return NULL;
    return se->session;
}